

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O1

void fsg_search_free(ps_search_t *search)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  iVar1 = *(int *)&search[2].dag;
  lVar2 = ps_config_int(search->config,"frate");
  dVar3 = (double)iVar1 / (double)lVar2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
          ,0x10d,"TOTAL fsg %.2f CPU %.3f xRT\n",search[2].acmod,(double)search[2].acmod / dVar3);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
          ,0x110,"TOTAL fsg %.2f wall %.3f xRT\n",search[2].dict,(double)search[2].dict / dVar3);
  ps_search_base_free(search);
  fsg_lextree_free((fsg_lextree_t *)search[1].name);
  if (search[1].pls != (ps_search_t *)0x0) {
    fsg_history_reset((fsg_history_t *)search[1].pls);
    fsg_history_set_fsg((fsg_history_t *)search[1].pls,(fsg_model_t *)0x0,(dict_t *)0x0);
    fsg_history_free((fsg_history_t *)search[1].pls);
  }
  hmm_context_free((hmm_context_t *)search[1].vt);
  fsg_model_free((fsg_model_t *)search[1].type);
  ckd_free(search);
  return;
}

Assistant:

void
fsg_search_free(ps_search_t *search)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;

    double n_speech = (double)fsgs->n_tot_frame
            / ps_config_int(ps_search_config(fsgs), "frate");

    E_INFO("TOTAL fsg %.2f CPU %.3f xRT\n",
           fsgs->perf.t_tot_cpu,
           fsgs->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL fsg %.2f wall %.3f xRT\n",
           fsgs->perf.t_tot_elapsed,
           fsgs->perf.t_tot_elapsed / n_speech);

    ps_search_base_free(search);
    fsg_lextree_free(fsgs->lextree);
    if (fsgs->history) {
        fsg_history_reset(fsgs->history);
        fsg_history_set_fsg(fsgs->history, NULL, NULL);
        fsg_history_free(fsgs->history);
    }
    hmm_context_free(fsgs->hmmctx);
    fsg_model_free(fsgs->fsg);
    ckd_free(fsgs);
}